

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomElementPrivate * __thiscall QDomDocumentPrivate::documentElement(QDomDocumentPrivate *this)

{
  bool bVar1;
  long in_RDI;
  QDomNodePrivate *p;
  byte local_11;
  QDomElementPrivate *local_10;
  
  local_10 = *(QDomElementPrivate **)(in_RDI + 0x28);
  while( true ) {
    local_11 = 0;
    if (local_10 != (QDomElementPrivate *)0x0) {
      bVar1 = QDomNodePrivate::isElement((QDomNodePrivate *)0x11ac33);
      local_11 = bVar1 ^ 0xff;
    }
    if ((local_11 & 1) == 0) break;
    local_10 = (QDomElementPrivate *)(local_10->super_QDomNodePrivate).next;
  }
  return local_10;
}

Assistant:

QDomElementPrivate* QDomDocumentPrivate::documentElement()
{
    QDomNodePrivate *p = first;
    while (p && !p->isElement())
        p = p->next;

    return static_cast<QDomElementPrivate *>(p);
}